

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGSimplify(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict cur,
                       xmlRelaxNGDefinePtr_conflict parent)

{
  xmlRelaxNGDefinePtr *ppxVar1;
  xmlRelaxNGDefinePtr pxVar2;
  int iVar3;
  xmlRelaxNGType xVar4;
  xmlRelaxNGParserCtxtPtr pxVar5;
  xmlRelaxNGDefinePtr_conflict def;
  xmlRelaxNGDefinePtr_conflict pxVar6;
  xmlRelaxNGParserCtxtPtr parent_00;
  
  if (cur != (xmlRelaxNGDefinePtr_conflict)0x0) {
    parent_00 = (xmlRelaxNGParserCtxtPtr)0x0;
    do {
      xVar4 = *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData;
      pxVar5 = parent_00;
      if (xVar4 < XML_RELAXNG_REF) {
        if (xVar4 == XML_RELAXNG_EMPTY) {
          ((xmlRelaxNGParserCtxtPtr)cur)->parentgrammar = (xmlRelaxNGGrammarPtr_conflict)parent;
          pxVar5 = (xmlRelaxNGParserCtxtPtr)cur;
          if (parent != (xmlRelaxNGDefinePtr_conflict)0x0) {
            if ((uint)(parent->type + ~XML_RELAXNG_OPTIONAL) < 2) {
LAB_00187962:
              xVar4 = XML_RELAXNG_EMPTY;
              goto LAB_00187964;
            }
            if ((parent->type & ~XML_RELAXNG_NOT_ALLOWED) == XML_RELAXNG_GROUP) goto LAB_001878d7;
          }
        }
        else {
          if (xVar4 != XML_RELAXNG_NOT_ALLOWED) goto LAB_00187735;
          ((xmlRelaxNGParserCtxtPtr)cur)->parentgrammar = (xmlRelaxNGGrammarPtr_conflict)parent;
LAB_001876d1:
          pxVar5 = (xmlRelaxNGParserCtxtPtr)cur;
          if ((parent != (xmlRelaxNGDefinePtr_conflict)0x0) &&
             (xVar4 = parent->type, (uint)xVar4 < 0x14)) {
            if (xVar4 == XML_RELAXNG_CHOICE) {
LAB_001878d7:
              if (parent_00 == (xmlRelaxNGParserCtxtPtr)0x0) {
                if ((xmlRelaxNGParserCtxtPtr)parent->content == (xmlRelaxNGParserCtxtPtr)cur) {
                  parent->content = *(xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->flags;
                }
                else if ((xmlRelaxNGParserCtxtPtr)parent->attrs == (xmlRelaxNGParserCtxtPtr)cur) {
                  parent->attrs = *(xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->flags;
                }
                else if ((xmlRelaxNGParserCtxtPtr)parent->nameClass == (xmlRelaxNGParserCtxtPtr)cur)
                {
                  parent->nameClass = *(xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->flags
                  ;
                }
                pxVar5 = (xmlRelaxNGParserCtxtPtr)0x0;
              }
              else {
                *(xmlRelaxNGDefinePtr *)&parent_00->flags =
                     *(xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->flags;
                pxVar5 = parent_00;
              }
            }
            else if ((0xd8300U >> (xVar4 & (XML_RELAXNG_ONEORMORE|XML_RELAXNG_ZEROORMORE)) & 1) != 0
                    ) {
              xVar4 = XML_RELAXNG_NOT_ALLOWED;
LAB_00187964:
              parent->type = xVar4;
              return;
            }
          }
        }
      }
      else if ((xVar4 == XML_RELAXNG_PARENTREF) || (xVar4 == XML_RELAXNG_REF)) {
        if ((short)((xmlRelaxNGParserCtxtPtr)cur)->nbInterleaves != -3) {
          *(short *)&((xmlRelaxNGParserCtxtPtr)cur)->nbInterleaves = -3;
          xmlRelaxNGSimplify(ctxt,(xmlRelaxNGDefinePtr_conflict)
                                  ((xmlRelaxNGParserCtxtPtr)cur)->grammar,cur);
        }
      }
      else {
LAB_00187735:
        ((xmlRelaxNGParserCtxtPtr)cur)->parentgrammar = (xmlRelaxNGGrammarPtr_conflict)parent;
        if ((xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->grammar !=
            (xmlRelaxNGDefinePtr_conflict)0x0) {
          xmlRelaxNGSimplify(ctxt,(xmlRelaxNGDefinePtr_conflict)
                                  ((xmlRelaxNGParserCtxtPtr)cur)->grammar,cur);
        }
        if ((*(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData != XML_RELAXNG_VALUE) &&
           (*(xmlRelaxNGDefinePtr_conflict *)&((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings !=
            (xmlRelaxNGDefinePtr_conflict)0x0)) {
          xmlRelaxNGSimplify(ctxt,*(xmlRelaxNGDefinePtr_conflict *)
                                   &((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings,cur);
        }
        if ((xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->define !=
            (xmlRelaxNGDefinePtr_conflict)0x0) {
          xmlRelaxNGSimplify(ctxt,(xmlRelaxNGDefinePtr_conflict)
                                  ((xmlRelaxNGParserCtxtPtr)cur)->define,cur);
        }
        if (*(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData == XML_RELAXNG_ELEMENT) {
          pxVar6 = (xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->grammar;
          while ((pxVar6 != (xmlRelaxNGDefinePtr_conflict)0x0 &&
                 (iVar3 = xmlRelaxNGGenerateAttributes(ctxt,pxVar6), iVar3 == 1))) {
            pxVar2 = (xmlRelaxNGDefinePtr)((xmlRelaxNGParserCtxtPtr)cur)->grammar;
            pxVar6 = pxVar2->next;
            ((xmlRelaxNGParserCtxtPtr)cur)->grammar = (xmlRelaxNGGrammarPtr_conflict)pxVar6;
            pxVar2->next = *(xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings;
            *(xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings = pxVar2;
          }
          pxVar6 = (xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->grammar;
          if (pxVar6 != (xmlRelaxNGDefinePtr_conflict)0x0) {
            for (def = pxVar6->next; def != (xmlRelaxNGDefinePtr_conflict)0x0; def = def->next) {
              iVar3 = xmlRelaxNGGenerateAttributes(ctxt,def);
              if (iVar3 == 1) {
                pxVar6->next = def->next;
                def->next = *(xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings;
                *(xmlRelaxNGDefinePtr_conflict *)&((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings = def;
                def = pxVar6;
              }
              pxVar6 = def;
            }
          }
        }
        if (((ulong)((xmlRelaxNGParserCtxtPtr)cur)->userData & 0xfffffffe) == 0x12) {
          pxVar5 = (xmlRelaxNGParserCtxtPtr)((xmlRelaxNGParserCtxtPtr)cur)->grammar;
          if (pxVar5 == (xmlRelaxNGParserCtxtPtr)0x0) {
            *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData = XML_RELAXNG_EMPTY;
          }
          else if (*(xmlRelaxNGDefinePtr *)&pxVar5->flags == (xmlRelaxNGDefinePtr)0x0) {
            if (parent == (xmlRelaxNGDefinePtr_conflict)0x0 &&
                parent_00 == (xmlRelaxNGParserCtxtPtr)0x0) {
              *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData = XML_RELAXNG_NOOP;
            }
            else if (parent_00 == (xmlRelaxNGParserCtxtPtr)0x0) {
              parent->content = (xmlRelaxNGDefinePtr)pxVar5;
              ppxVar1 = (xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->flags;
              cur = (xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->grammar;
              *(xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->flags = *ppxVar1;
            }
            else {
              *(xmlRelaxNGDefinePtr *)&pxVar5->flags =
                   *(xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->flags;
              *(xmlRelaxNGParserCtxtPtr *)&parent_00->flags = pxVar5;
              cur = (xmlRelaxNGDefinePtr_conflict)pxVar5;
            }
          }
        }
        iVar3 = *(int *)&((xmlRelaxNGParserCtxtPtr)cur)->userData;
        pxVar5 = (xmlRelaxNGParserCtxtPtr)cur;
        if (iVar3 == 0) {
          if (parent != (xmlRelaxNGDefinePtr_conflict)0x0) {
            if ((uint)(parent->type + ~XML_RELAXNG_OPTIONAL) < 2) goto LAB_00187962;
            if ((uint)(parent->type + ~XML_RELAXNG_ONEORMORE) < 3) goto LAB_001878d7;
          }
        }
        else {
          if (iVar3 == 1) goto LAB_001876d1;
          if (((iVar3 == 2) &&
              (pxVar6 = (xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->grammar,
              pxVar6 != (xmlRelaxNGDefinePtr_conflict)0x0)) &&
             (pxVar6->type == XML_RELAXNG_NOT_ALLOWED)) {
            pxVar5 = (xmlRelaxNGParserCtxtPtr)
                     xmlRelaxNGTryUnlink((xmlRelaxNGParserCtxtPtr)cur,parent,
                                         (xmlRelaxNGDefinePtr_conflict)parent_00,pxVar6);
          }
        }
      }
      cur = *(xmlRelaxNGDefinePtr_conflict *)&((xmlRelaxNGParserCtxtPtr)cur)->flags;
      parent_00 = pxVar5;
    } while ((xmlRelaxNGParserCtxtPtr)cur != (xmlRelaxNGParserCtxtPtr)0x0);
  }
  return;
}

Assistant:

static void
xmlRelaxNGSimplify(xmlRelaxNGParserCtxtPtr ctxt,
                   xmlRelaxNGDefinePtr cur, xmlRelaxNGDefinePtr parent)
{
    xmlRelaxNGDefinePtr prev = NULL;

    while (cur != NULL) {
        if ((cur->type == XML_RELAXNG_REF) ||
            (cur->type == XML_RELAXNG_PARENTREF)) {
            if (cur->depth != -3) {
                cur->depth = -3;
                xmlRelaxNGSimplify(ctxt, cur->content, cur);
            }
        } else if (cur->type == XML_RELAXNG_NOT_ALLOWED) {
            cur->parent = parent;
            if ((parent != NULL) &&
                ((parent->type == XML_RELAXNG_ATTRIBUTE) ||
                 (parent->type == XML_RELAXNG_LIST) ||
                 (parent->type == XML_RELAXNG_GROUP) ||
                 (parent->type == XML_RELAXNG_INTERLEAVE) ||
                 (parent->type == XML_RELAXNG_ONEORMORE) ||
                 (parent->type == XML_RELAXNG_ZEROORMORE))) {
                parent->type = XML_RELAXNG_NOT_ALLOWED;
                break;
            }
            if ((parent != NULL) && (parent->type == XML_RELAXNG_CHOICE)) {
                prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
            } else
                prev = cur;
        } else if (cur->type == XML_RELAXNG_EMPTY) {
            cur->parent = parent;
            if ((parent != NULL) &&
                ((parent->type == XML_RELAXNG_ONEORMORE) ||
                 (parent->type == XML_RELAXNG_ZEROORMORE))) {
                parent->type = XML_RELAXNG_EMPTY;
                break;
            }
            if ((parent != NULL) &&
                ((parent->type == XML_RELAXNG_GROUP) ||
                 (parent->type == XML_RELAXNG_INTERLEAVE))) {
                prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
            } else
                prev = cur;
        } else {
            cur->parent = parent;
            if (cur->content != NULL)
                xmlRelaxNGSimplify(ctxt, cur->content, cur);
            if ((cur->type != XML_RELAXNG_VALUE) && (cur->attrs != NULL))
                xmlRelaxNGSimplify(ctxt, cur->attrs, cur);
            if (cur->nameClass != NULL)
                xmlRelaxNGSimplify(ctxt, cur->nameClass, cur);
            /*
             * On Elements, try to move attribute only generating rules on
             * the attrs rules.
             */
            if (cur->type == XML_RELAXNG_ELEMENT) {
                int attronly;
                xmlRelaxNGDefinePtr tmp, pre;

                while (cur->content != NULL) {
                    attronly =
                        xmlRelaxNGGenerateAttributes(ctxt, cur->content);
                    if (attronly == 1) {
                        /*
                         * migrate cur->content to attrs
                         */
                        tmp = cur->content;
                        cur->content = tmp->next;
                        tmp->next = cur->attrs;
                        cur->attrs = tmp;
                    } else {
                        /*
                         * cur->content can generate elements or text
                         */
                        break;
                    }
                }
                pre = cur->content;
                while ((pre != NULL) && (pre->next != NULL)) {
                    tmp = pre->next;
                    attronly = xmlRelaxNGGenerateAttributes(ctxt, tmp);
                    if (attronly == 1) {
                        /*
                         * migrate tmp to attrs
                         */
                        pre->next = tmp->next;
                        tmp->next = cur->attrs;
                        cur->attrs = tmp;
                    } else {
                        pre = tmp;
                    }
                }
            }
            /*
             * This may result in a simplification
             */
            if ((cur->type == XML_RELAXNG_GROUP) ||
                (cur->type == XML_RELAXNG_INTERLEAVE)) {
                if (cur->content == NULL)
                    cur->type = XML_RELAXNG_EMPTY;
                else if (cur->content->next == NULL) {
                    if ((parent == NULL) && (prev == NULL)) {
                        cur->type = XML_RELAXNG_NOOP;
                    } else if (prev == NULL) {
                        parent->content = cur->content;
                        cur->content->next = cur->next;
                        cur = cur->content;
                    } else {
                        cur->content->next = cur->next;
                        prev->next = cur->content;
                        cur = cur->content;
                    }
                }
            }
            /*
             * the current node may have been transformed back
             */
            if ((cur->type == XML_RELAXNG_EXCEPT) &&
                (cur->content != NULL) &&
                (cur->content->type == XML_RELAXNG_NOT_ALLOWED)) {
                prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
            } else if (cur->type == XML_RELAXNG_NOT_ALLOWED) {
                if ((parent != NULL) &&
                    ((parent->type == XML_RELAXNG_ATTRIBUTE) ||
                     (parent->type == XML_RELAXNG_LIST) ||
                     (parent->type == XML_RELAXNG_GROUP) ||
                     (parent->type == XML_RELAXNG_INTERLEAVE) ||
                     (parent->type == XML_RELAXNG_ONEORMORE) ||
                     (parent->type == XML_RELAXNG_ZEROORMORE))) {
                    parent->type = XML_RELAXNG_NOT_ALLOWED;
                    break;
                }
                if ((parent != NULL) &&
                    (parent->type == XML_RELAXNG_CHOICE)) {
                    prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
                } else
                    prev = cur;
            } else if (cur->type == XML_RELAXNG_EMPTY) {
                if ((parent != NULL) &&
                    ((parent->type == XML_RELAXNG_ONEORMORE) ||
                     (parent->type == XML_RELAXNG_ZEROORMORE))) {
                    parent->type = XML_RELAXNG_EMPTY;
                    break;
                }
                if ((parent != NULL) &&
                    ((parent->type == XML_RELAXNG_GROUP) ||
                     (parent->type == XML_RELAXNG_INTERLEAVE) ||
                     (parent->type == XML_RELAXNG_CHOICE))) {
                    prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
                } else
                    prev = cur;
            } else {
                prev = cur;
            }
        }
        cur = cur->next;
    }
}